

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setBasis(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,VarStatus *p_rows,VarStatus *p_cols)

{
  SPxStatus SVar1;
  int iVar2;
  Status *pSVar3;
  Desc *in_RDI;
  int i;
  Desc ds;
  int in_stack_ffffffffffffff6c;
  Status in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int iVar4;
  undefined4 in_stack_ffffffffffffff78;
  Status in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  Desc *in_stack_ffffffffffffff90;
  int local_5c;
  undefined1 local_58 [32];
  VarStatus in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffffd0;
  
  SVar1 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::status((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)&in_RDI[8].rowstat.data);
  if (SVar1 == NO_PROBLEM) {
    SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::load((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
           (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
           SUB41((uint)in_stack_ffffffffffffff74 >> 0x18,0));
  }
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::desc((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)&in_RDI[8].rowstat.data);
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::Desc::Desc(in_stack_ffffffffffffff90,in_RDI);
  local_5c = 0;
  while( true ) {
    iVar4 = local_5c;
    iVar2 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x611a4b);
    if (iVar2 <= iVar4) break;
    in_stack_ffffffffffffff7c =
         varStatusToBasisStatusRow
                   (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    pSVar3 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::Desc::rowStatus((Desc *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                               ,in_stack_ffffffffffffff6c);
    *pSVar3 = in_stack_ffffffffffffff7c;
    local_5c = local_5c + 1;
  }
  local_5c = 0;
  while( true ) {
    iVar4 = local_5c;
    iVar2 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x611ad7);
    if (iVar2 <= iVar4) break;
    in_stack_ffffffffffffff70 =
         varStatusToBasisStatusCol
                   (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    pSVar3 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::Desc::colStatus((Desc *)CONCAT44(iVar4,in_stack_ffffffffffffff70),
                               in_stack_ffffffffffffff6c);
    *pSVar3 = in_stack_ffffffffffffff70;
    local_5c = local_5c + 1;
  }
  (**(code **)(*(long *)&in_RDI->rowstat + 0x2c0))(in_RDI,local_58);
  forceRecompNonbasicValue
            ((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)CONCAT44(in_stack_ffffffffffffff7c,iVar2));
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::Desc::~Desc((Desc *)CONCAT44(iVar4,in_stack_ffffffffffffff70));
  return;
}

Assistant:

void SPxSolverBase<R>::setBasis(const VarStatus p_rows[], const VarStatus p_cols[])
   {
      if(SPxBasisBase<R>::status() == SPxBasisBase<R>::NO_PROBLEM)
         SPxBasisBase<R>::load(this, false);

      typename SPxBasisBase<R>::Desc ds = this->desc();
      int i;

      for(i = 0; i < this->nRows(); i++)
         ds.rowStatus(i) = varStatusToBasisStatusRow(i, p_rows[i]);

      for(i = 0; i < this->nCols(); i++)
         ds.colStatus(i) = varStatusToBasisStatusCol(i, p_cols[i]);

      loadBasis(ds);
      forceRecompNonbasicValue();
   }